

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShortcutsWindow.cpp
# Opt level: O3

void __thiscall cursespp::ShortcutsWindow::ProcessMouseEvent(ShortcutsWindow *this)

{
  Event *in_RSI;
  
  ProcessMouseEvent((ShortcutsWindow *)((long)&this[-1].originalKey.field_2 + 8),in_RSI);
  return;
}

Assistant:

bool ShortcutsWindow::ProcessMouseEvent(const IMouseHandler::Event& mouseEvent) {
    if (mouseEvent.Button1Clicked()) {
        for (auto entry : this->entries) {
            auto& pos = entry->position;
            if (mouseEvent.x >= pos.offset &&
                mouseEvent.x < pos.offset + pos.width)
            {
                this->activeKey = entry->key;

                this->Redraw();

                if (this->changedCallback) {
                    this->changedCallback(this->activeKey);
                }

                return true;
            }
        }
    }
    return Window::ProcessMouseEvent(mouseEvent);
}